

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvncclient.cpp
# Opt level: O2

void __thiscall QVncClient::setEncodings(QVncClient *this)

{
  long lVar1;
  uint uVar2;
  ssize_t sVar3;
  ulong uVar4;
  QLoggingCategory *pQVar5;
  undefined8 *puVar6;
  size_t in_RCX;
  void *in_RDX;
  int i;
  int iVar7;
  long in_FS_OFFSET;
  char local_60 [24];
  char *local_48;
  qint32 enc_1;
  QRfbSetEncodings enc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  enc.count = 0xaaaa;
  if (((*(int *)(this + 0x58) == 0) &&
      (sVar3 = QRfbSetEncodings::read(&enc,(int)*(undefined8 *)(this + 0x18),in_RDX,in_RCX),
      (char)sVar3 != '\0')) && (*(uint *)(this + 0x58) = (uint)enc.count, enc.count == 0)) {
    this[0x2d] = (QVncClient)0x0;
  }
  if (*(long **)(this + 0x20) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x20) + 8))();
    *(undefined8 *)(this + 0x20) = 0;
  }
  if (*(int *)(this + 0x58) != 0) {
    uVar2 = (**(code **)(**(long **)(this + 0x18) + 0xa0))();
    uVar4 = (ulong)*(int *)(this + 0x58);
    if (uVar4 * 4 <= (ulong)uVar2) {
      for (iVar7 = 0; iVar7 < (int)uVar4; iVar7 = iVar7 + 1) {
        enc_1 = -0x55555556;
        QIODevice::read(*(char **)(this + 0x18),(longlong)&enc_1);
        enc_1 = (uint)enc_1 >> 0x18 | (enc_1 & 0xff0000U) >> 8 | (enc_1 & 0xff00U) << 8 |
                enc_1 << 0x18;
        pQVar5 = lcVnc();
        if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_48 = pQVar5->name;
          local_60[0] = '\x02';
          local_60[1] = '\0';
          local_60[2] = '\0';
          local_60[3] = '\0';
          local_60[0x14] = '\0';
          local_60[0x15] = '\0';
          local_60[0x16] = '\0';
          local_60[0x17] = '\0';
          local_60[4] = '\0';
          local_60[5] = '\0';
          local_60[6] = '\0';
          local_60[7] = '\0';
          local_60[8] = '\0';
          local_60[9] = '\0';
          local_60[10] = '\0';
          local_60[0xb] = '\0';
          local_60[0xc] = '\0';
          local_60[0xd] = '\0';
          local_60[0xe] = '\0';
          local_60[0xf] = '\0';
          local_60[0x10] = '\0';
          local_60[0x11] = '\0';
          local_60[0x12] = '\0';
          local_60[0x13] = '\0';
          QMessageLogger::debug(local_60,"QVncServer::setEncodings: %d",(ulong)(uint)enc_1);
        }
        switch(enc_1) {
        case 0:
          if (*(long *)(this + 0x20) == 0) {
            puVar6 = (undefined8 *)operator_new(0x28);
            puVar6[1] = this;
            *puVar6 = &PTR__QRfbRawEncoder_0011d938;
            puVar6[2] = 0;
            puVar6[3] = 0;
            puVar6[4] = 0;
            *(undefined8 **)(this + 0x20) = puVar6;
            pQVar5 = lcVnc();
            if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
              local_48 = pQVar5->name;
              local_60[0] = '\x02';
              local_60[1] = '\0';
              local_60[2] = '\0';
              local_60[3] = '\0';
              local_60[4] = '\0';
              local_60[5] = '\0';
              local_60[6] = '\0';
              local_60[7] = '\0';
              local_60[8] = '\0';
              local_60[9] = '\0';
              local_60[10] = '\0';
              local_60[0xb] = '\0';
              local_60[0xc] = '\0';
              local_60[0xd] = '\0';
              local_60[0xe] = '\0';
              local_60[0xf] = '\0';
              local_60[0x10] = '\0';
              local_60[0x11] = '\0';
              local_60[0x12] = '\0';
              local_60[0x13] = '\0';
              local_60[0x14] = '\0';
              local_60[0x15] = '\0';
              local_60[0x16] = '\0';
              local_60[0x17] = '\0';
              QMessageLogger::debug(local_60,"QVncServer::setEncodings: using raw");
            }
          }
          break;
        case 1:
          this[0x60] = (QVncClient)((byte)this[0x60] | 1);
          break;
        case 2:
          this[0x60] = (QVncClient)((byte)this[0x60] | 2);
          break;
        case 3:
          break;
        case 4:
          this[0x60] = (QVncClient)((byte)this[0x60] | 4);
          break;
        case 5:
          this[0x60] = (QVncClient)((byte)this[0x60] | 8);
          break;
        default:
          if (enc_1 == -0xef) {
            this[0x60] = (QVncClient)((byte)this[0x60] | 0x20);
            QVncScreen::enableClientCursor
                      (*(QVncScreen **)(*(long *)(this + 0x10) + 0x30),(QVncClient *)this);
          }
          else if (enc_1 == -0xdf) {
            this[0x60] = (QVncClient)((byte)this[0x60] | 0x40);
          }
          else if (enc_1 == 0x10) {
            this[0x60] = (QVncClient)((byte)this[0x60] | 0x10);
          }
        }
        uVar4 = (ulong)*(uint *)(this + 0x58);
      }
      this[0x2d] = (QVncClient)0x0;
      *(undefined4 *)(this + 0x58) = 0;
    }
  }
  if (*(long *)(this + 0x20) == 0) {
    puVar6 = (undefined8 *)operator_new(0x28);
    puVar6[1] = this;
    *puVar6 = &PTR__QRfbRawEncoder_0011d938;
    puVar6[2] = 0;
    puVar6[3] = 0;
    puVar6[4] = 0;
    *(undefined8 **)(this + 0x20) = puVar6;
    pQVar5 = lcVnc();
    if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_48 = pQVar5->name;
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      QMessageLogger::debug(local_60,"QVncServer::setEncodings: fallback using raw");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVncClient::setEncodings()
{
    QRfbSetEncodings enc;

    if (!m_encodingsPending && enc.read(m_clientSocket)) {
        m_encodingsPending = enc.count;
        if (!m_encodingsPending)
            m_handleMsg = false;
    }

    if (m_encoder) {
        delete m_encoder;
        m_encoder = nullptr;
    }

    enum Encodings {
        Raw = 0,
        CopyRect = 1,
        RRE = 2,
        CoRRE = 4,
        Hextile = 5,
        ZRLE = 16,
        Cursor = -239,
        DesktopSize = -223
    };

    if (m_encodingsPending && (unsigned)m_clientSocket->bytesAvailable() >=
                                m_encodingsPending * sizeof(quint32)) {
        for (int i = 0; i < m_encodingsPending; ++i) {
            qint32 enc;
            m_clientSocket->read((char *)&enc, sizeof(qint32));
            enc = ntohl(enc);
            qCDebug(lcVnc, "QVncServer::setEncodings: %d", enc);
            switch (enc) {
            case Raw:
                if (!m_encoder) {
                    m_encoder = new QRfbRawEncoder(this);
                    qCDebug(lcVnc, "QVncServer::setEncodings: using raw");
                }
               break;
            case CopyRect:
                m_supportCopyRect = true;
                break;
            case RRE:
                m_supportRRE = true;
                break;
            case CoRRE:
                m_supportCoRRE = true;
                break;
            case Hextile:
                m_supportHextile = true;
                if (m_encoder)
                    break;
                break;
            case ZRLE:
                m_supportZRLE = true;
                break;
            case Cursor:
                m_supportCursor = true;
                m_server->screen()->enableClientCursor(this);
                break;
            case DesktopSize:
                m_supportDesktopSize = true;
                break;
            default:
                break;
            }
        }
        m_handleMsg = false;
        m_encodingsPending = 0;
    }

    if (!m_encoder) {
        m_encoder = new QRfbRawEncoder(this);
        qCDebug(lcVnc, "QVncServer::setEncodings: fallback using raw");
    }
}